

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O2

RC __thiscall PF_BufferMgr::UnpinPage(PF_BufferMgr *this,int fd,PageNum pageNum)

{
  RC RVar1;
  undefined8 in_RAX;
  short sVar2;
  int slot;
  
  slot = (int)((ulong)in_RAX >> 0x20);
  RVar1 = PF_HashTable::Find(&this->hashTable,fd,pageNum,&slot);
  if (RVar1 == -8) {
    RVar1 = 2;
  }
  else if (RVar1 == 0) {
    sVar2 = this->bufTable[slot].pinCount;
    if (sVar2 == 0) {
      RVar1 = 7;
    }
    else {
      sVar2 = sVar2 + -1;
      this->bufTable[slot].pinCount = sVar2;
      RVar1 = 0;
      if (sVar2 == 0) {
        Unlink(this,slot);
        LinkHead(this,slot);
        RVar1 = 0;
      }
    }
  }
  return RVar1;
}

Assistant:

RC PF_BufferMgr::UnpinPage(int fd, PageNum pageNum)
{
   RC  rc;       // return code
   int slot;     // buffer slot where page is located

   // The page must be found and pinned in the buffer
   if ((rc = hashTable.Find(fd, pageNum, slot))){
      if ((rc == PF_HASHNOTFOUND))
         return (PF_PAGENOTINBUF);
      else
         return (rc);              // unexpected error
   }

   if (bufTable[slot].pinCount == 0)
      return (PF_PAGEUNPINNED);

#ifdef PF_LOG
   char psMessage[100];
   sprintf (psMessage, "Unpinning (%d,%d). %d Pin count\n",
         fd, pageNum, bufTable[slot].pinCount-1);
   WriteLog(psMessage);
#endif

   // If unpinning the last pin, make it the most recently used page
   if (--(bufTable[slot].pinCount) == 0) {
      if ((rc = Unlink(slot)) ||
            (rc = LinkHead (slot)))
         return (rc);
   }

   // Return ok
   return (0);
}